

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::bin_writer<1>::operator()
          (bin_writer<1> *this,ostream_iterator<char,_char,_std::char_traits<char>_> *it)

{
  int iVar1;
  bool bVar2;
  byte *pbVar3;
  ulong uVar4;
  long lVar5;
  char *__value;
  char buffer [66];
  ostream_iterator<char,_char,_std::char_traits<char>_> local_78;
  char local_68 [72];
  
  local_78._M_stream = it->_M_stream;
  local_78._M_string = it->_M_string;
  iVar1 = *(int *)(this + 8);
  lVar5 = (long)iVar1;
  __value = local_68;
  pbVar3 = (byte *)(local_68 + lVar5 + -1);
  uVar4 = *(ulong *)this;
  do {
    *pbVar3 = (byte)uVar4 & 1 | 0x30;
    pbVar3 = pbVar3 + -1;
    bVar2 = 1 < uVar4;
    uVar4 = uVar4 >> 1;
  } while (bVar2);
  if (0 < iVar1) {
    do {
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_78,__value);
      __value = __value + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  it->_M_stream = local_78._M_stream;
  it->_M_string = local_78._M_string;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<BITS, char_type>(it, abs_value, num_digits);
      }